

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O1

stacktrace * __thiscall
cpptrace::detail::lazy_trace_holder::get_resolved_trace(lazy_trace_holder *this)

{
  raw_trace old_trace;
  raw_trace local_80;
  stacktrace local_68;
  lazy_trace_holder local_48;
  
  if (this->resolved == false) {
    local_80.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->field_1).trace.frames.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_80.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->field_1).trace.frames.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_80.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (this->field_1).trace.frames.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.frames.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.resolved = true;
    local_48.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.frames.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.frames.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    clear(this);
    this->resolved = local_48.resolved;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_48.field_1.trace.frames.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.field_1.trace.frames.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.field_1.trace.frames.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    clear(&local_48);
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (&local_68.frames);
    if (local_80.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_80.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      raw_trace::resolve(&local_68,&local_80);
      local_48._0_8_ =
           (this->field_1).trace.frames.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.field_1.trace.frames.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (this->field_1).trace.frames.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.field_1.trace.frames.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (this->field_1).trace.frames.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start =
           &(local_68.frames.
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_start)->raw_address;
      (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           &(local_68.frames.
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_finish)->raw_address;
      (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &(local_68.frames.
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->raw_address;
      local_68.frames.
      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.frames.
      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.frames.
      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
                ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
                 &local_48);
      std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
                (&local_68.frames);
    }
    if (local_80.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.frames.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.frames.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.frames.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (stacktrace *)&this->field_1;
}

Assistant:

stacktrace& lazy_trace_holder::get_resolved_trace() {
            if(!resolved) {
                raw_trace old_trace = std::move(trace);
                *this = lazy_trace_holder(stacktrace{});
                try {
                    if(!old_trace.empty()) {
                        resolved_trace = old_trace.resolve();
                    }
                } catch(const std::exception& e) {
                    if(!detail::should_absorb_trace_exceptions()) {
                        // TODO: Append to message somehow?
                        std::fprintf(
                            stderr,
                            "Exception occurred while resolving trace in cpptrace::detail::lazy_trace_holder:\n%s\n",
                            e.what()
                        );
                    }
                }
            }
            return resolved_trace;
        }